

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_playground.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  int iVar2;
  MyClass *pMVar3;
  ostream *poVar4;
  undefined1 local_50 [8];
  shared_ptr_t<MyClass> s_ptr;
  shared_ptr_t<MyClass> mc2;
  undefined1 local_20 [8];
  shared_ptr_t<MyClass> mc1;
  
  mc1.control_block_ptr_._4_4_ = 0;
  pMVar3 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar3,10);
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)local_20,pMVar3);
  estl::shared_ptr<MyClass>::shared_ptr
            ((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_,(shared_ptr<MyClass> *)local_20);
  poVar4 = std::operator<<((ostream *)&std::cerr,"mc1.use_clount(2) : ");
  uVar1 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,",  mc1.value: ");
  pMVar3 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)local_20);
  iVar2 = MyClass::val(pMVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cerr,"mc2.use_count(2) : ");
  uVar1 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,",  mc2.value: ");
  pMVar3 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_);
  iVar2 = MyClass::val(pMVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  pMVar3 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar3,0x14);
  estl::shared_ptr<MyClass>::reset((shared_ptr<MyClass> *)local_20,pMVar3);
  poVar4 = std::operator<<((ostream *)&std::cerr,"mc1.use_count(1) : ");
  uVar1 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)local_20);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,",  mc1.value: ");
  pMVar3 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)local_20);
  iVar2 = MyClass::val(pMVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cerr,"mc2.use_count(1) : ");
  uVar1 = estl::shared_ptr<MyClass>::use_count((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,",  mc2.value: ");
  pMVar3 = estl::shared_ptr<MyClass>::operator->((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_);
  iVar2 = MyClass::val(pMVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  estl::shared_ptr<MyClass>::~shared_ptr((shared_ptr<MyClass> *)&s_ptr.control_block_ptr_);
  estl::shared_ptr<MyClass>::~shared_ptr((shared_ptr<MyClass> *)local_20);
  pMVar3 = (MyClass *)operator_new(4);
  MyClass::MyClass(pMVar3);
  estl::shared_ptr<MyClass>::shared_ptr((shared_ptr<MyClass> *)local_50,pMVar3);
  mc1.control_block_ptr_._4_4_ = 0;
  estl::shared_ptr<MyClass>::~shared_ptr((shared_ptr<MyClass> *)local_50);
  return mc1.control_block_ptr_._4_4_;
}

Assistant:

int main()
{

    {
        shared_ptr_t<MyClass> mc1 = shared_ptr_t<MyClass>(new MyClass(10));
        auto mc2 = mc1;
        cerr << "mc1.use_clount(2) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(2) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
        mc1.reset(new MyClass(20));
        cerr << "mc1.use_count(1) : " << mc1.use_count() << ",  mc1.value: " << mc1->val() <<  "\n";
        cerr << "mc2.use_count(1) : " << mc2.use_count() << ",  mc2.value: " << mc2->val() <<  "\n";
    }

    shared_ptr_t<MyClass> s_ptr = shared_ptr_t<MyClass>(new MyClass());
    return 0;
}